

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  StringOutputStream output_stream;
  TextGenerator generator;
  
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&generator,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
               ,0x4aa);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)&generator,"CHECK failed: output: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"output specified is NULL");
    internal::LogFinisher::operator=((LogFinisher *)&output_stream,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&generator);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&output_stream,output);
  TextGenerator::TextGenerator
            (&generator,&output_stream.super_ZeroCopyOutputStream,this->initial_indent_level_);
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  PrintFieldValue(this,message,(Reflection *)CONCAT44(extraout_var,iVar1),field,index,&generator);
  TextGenerator::~TextGenerator(&generator);
  io::StringOutputStream::~StringOutputStream(&output_stream);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(
    const Message& message,
    const FieldDescriptor* field,
    int index,
    string* output) const {

  GOOGLE_DCHECK(output) << "output specified is NULL";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, generator);
}